

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler_internal.h
# Opt level: O0

long __thiscall
cubeb_resampler_speex<float,_delay_line<float>,_cubeb_resampler_speex_one_way<float>_>::latency
          (cubeb_resampler_speex<float,_delay_line<float>,_cubeb_resampler_speex_one_way<float>_>
           *this)

{
  bool bVar1;
  uint32_t uVar2;
  pointer pdVar3;
  cubeb_resampler_speex_one_way<float> *in_RDI;
  size_t local_8;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<delay_line<float>,_std::default_delete<delay_line<float>_>_> *)
                     0x11b26b);
  if ((bVar1) &&
     (bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                          *)0x11b27e), bVar1)) {
    pdVar3 = std::unique_ptr<delay_line<float>,_std::default_delete<delay_line<float>_>_>::
             operator->((unique_ptr<delay_line<float>,_std::default_delete<delay_line<float>_>_> *)
                        0x11b291);
    local_8 = delay_line<float>::latency(pdVar3);
  }
  else {
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<delay_line<float>,_std::default_delete<delay_line<float>_>_> *)
                       0x11b2ad);
    if (bVar1) {
      pdVar3 = std::unique_ptr<delay_line<float>,_std::default_delete<delay_line<float>_>_>::
               operator->((unique_ptr<delay_line<float>,_std::default_delete<delay_line<float>_>_> *
                          )0x11b2c0);
      local_8 = delay_line<float>::latency(pdVar3);
    }
    else {
      std::
      unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
      ::operator->((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                    *)0x11b2dc);
      uVar2 = cubeb_resampler_speex_one_way<float>::latency(in_RDI);
      local_8 = (size_t)uVar2;
    }
  }
  return local_8;
}

Assistant:

virtual long latency()
  {
    if (input_processor && output_processor) {
      assert(input_processor->latency() == output_processor->latency());
      return input_processor->latency();
    } else if (input_processor) {
      return input_processor->latency();
    } else {
      return output_processor->latency();
    }
  }